

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O2

bool __thiscall
libtorrent::aux::piece_picker::can_pick
          (piece_picker *this,piece_index_t piece,
          typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          *bitmask)

{
  uint uVar1;
  pointer ppVar2;
  bool bVar3;
  
  bVar3 = bitfield::get_bit(&bitmask->super_bitfield,piece.m_val);
  if (bVar3) {
    ppVar2 = (this->m_piece_map).
             super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
             .
             super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((prio_index_t *)((long)(ppVar2 + piece.m_val) + 4))->m_val != -1) {
      uVar1 = *(uint *)(ppVar2 + piece.m_val);
      return 0x1fffffff < uVar1 && (uVar1 & 0x1c000000) == 0x10000000;
    }
  }
  return false;
}

Assistant:

bool piece_picker::can_pick(piece_index_t const piece
		, typed_bitfield<piece_index_t> const& bitmask) const
	{
		return bitmask[piece]
			&& !m_piece_map[piece].have()
			// TODO: when expanding pieces for cache stripe reasons,
			// the !downloading condition doesn't make much sense
			&& !m_piece_map[piece].downloading()
			&& !m_piece_map[piece].filtered();
	}